

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  comment local_a8;
  string local_88 [32];
  string local_68 [32];
  location local_48;
  
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string(local_88,(string *)&e->kind);
  std::__cxx11::string::string(local_68,local_88);
  poVar1 = std::operator<<(poVar1,local_68);
  std::__cxx11::string::string((string *)&local_a8,(string *)&e->note);
  poVar1 = operator<<(poVar1,&local_a8);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string(local_108,pcVar2,&local_109);
  std::__cxx11::string::string(local_e8,local_108);
  std::__cxx11::string::string(local_c8,local_e8);
  poVar1 = std::operator<<(poVar1,local_c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}